

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5ConfigParse
              (Fts5Global *pGlobal,sqlite3 *db,int nArg,char **azArg,Fts5Config **ppOut,char **pzErr
              )

{
  char *pcVar1;
  bool bVar2;
  byte *pbVar3;
  u8 *zRight;
  int iVar4;
  Fts5Config *pFVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  int *piVar10;
  byte *pbVar11;
  long lVar12;
  char *pcVar13;
  byte bVar14;
  int N;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  byte *pbVar18;
  long lVar19;
  Fts5Config **ppFVar20;
  byte *pbVar21;
  byte *pbVar22;
  bool bVar23;
  int bDummy;
  int rc;
  char *zTwo;
  int bMustBeCol;
  char *zOne;
  uint local_b8;
  uint local_b4;
  char **local_b0;
  Fts5Config *local_a8;
  byte *local_a0;
  int local_94;
  byte *local_90;
  Fts5Buffer local_88;
  char **local_70;
  Fts5Tokenizer **local_68;
  byte *local_60;
  Fts5Global *local_58;
  Fts5Config **local_50;
  ulong local_48;
  char **local_40;
  fts5_tokenizer **local_38;
  
  local_b4 = 0;
  local_b0 = pzErr;
  local_58 = pGlobal;
  iVar4 = sqlite3_initialize();
  if (iVar4 == 0) {
    pFVar5 = (Fts5Config *)sqlite3Malloc(0xa8);
  }
  else {
    pFVar5 = (Fts5Config *)0x0;
  }
  *ppOut = pFVar5;
  if (pFVar5 == (Fts5Config *)0x0) {
    uVar15 = 7;
  }
  else {
    local_50 = ppOut;
    memset(pFVar5,0,0xa8);
    pFVar5->db = db;
    pFVar5->iCookie = -1;
    ppcVar6 = (char **)sqlite3Fts5MallocZero((int *)&local_b4,(long)nArg * 9);
    pFVar5->azCol = ppcVar6;
    pFVar5->abUnindexed = (u8 *)(ppcVar6 + nArg);
    pcVar7 = sqlite3Fts5Strndup((int *)&local_b4,azArg[1],-1);
    pFVar5->zDb = pcVar7;
    pcVar7 = sqlite3Fts5Strndup((int *)&local_b4,azArg[2],-1);
    pFVar5->zName = pcVar7;
    pFVar5->bColumnsize = 1;
    pFVar5->eDetail = 0;
    if ((pcVar7 != (char *)0x0 && local_b4 == 0) &&
       (iVar4 = sqlite3StrICmp(pcVar7,"rank"), iVar4 == 0)) {
      pcVar7 = sqlite3_mprintf("reserved fts5 table name: %s");
      *local_b0 = pcVar7;
      local_b4 = 1;
    }
    bVar23 = local_b4 == 0;
    local_a8 = pFVar5;
    if (3 < nArg && bVar23) {
      local_68 = &pFVar5->pTok;
      local_38 = &pFVar5->pTokApi;
      uVar16 = (ulong)(uint)nArg;
      uVar17 = 3;
      local_48 = uVar16;
      local_40 = azArg;
      do {
        local_88.p = (u8 *)0x0;
        local_a0 = (byte *)0x0;
        local_94 = 0;
        pcVar8 = fts5ConfigGobbleWord((int *)&local_b4,azArg[uVar17],(char **)&local_88,&local_94);
        pcVar7 = (char *)0x0;
        if (pcVar8 != (char *)0x0) {
          pcVar8 = pcVar8 + -1;
          do {
            pcVar7 = pcVar8 + 1;
            pcVar13 = pcVar8 + 1;
            pcVar8 = pcVar7;
          } while (*pcVar13 == ' ');
        }
        pcVar8 = (char *)0x1;
        if (pcVar7 == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else if (*pcVar7 == '=') {
          pcVar8 = (char *)0x0;
          pcVar7 = pcVar7 + 1;
          if (local_94 != 0) {
            pcVar7 = pcVar8;
          }
        }
        if (pcVar7 == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar13 = pcVar7 + -1;
          do {
            pcVar7 = pcVar13 + 1;
            pcVar1 = pcVar13 + 1;
            pcVar13 = pcVar7;
          } while (*pcVar1 == ' ');
        }
        if (pcVar7 == (char *)0x0) {
LAB_0019f3e5:
          bVar23 = true;
        }
        else if (*pcVar7 == '\0') {
          bVar23 = false;
        }
        else {
          pcVar7 = fts5ConfigGobbleWord((int *)&local_b4,pcVar7,(char **)&local_a0,(int *)&local_b8)
          ;
          if (pcVar7 == (char *)0x0) goto LAB_0019f3e5;
          bVar23 = *pcVar7 != '\0';
        }
        zRight = local_88.p;
        pbVar21 = local_a0;
        uVar15 = local_b4;
        if (local_b4 == 0) {
          if (bVar23) {
            pcVar7 = sqlite3_mprintf("parse error in \"%s\"");
            *local_b0 = pcVar7;
            local_b4 = 1;
            uVar15 = local_b4;
          }
          else if ((char)pcVar8 == '\0') {
            if (local_a0 == (byte *)0x0) {
              pbVar21 = (byte *)0x1d40dc;
            }
            local_b8 = 0;
            sVar9 = strlen((char *)local_88.p);
            N = (int)sVar9;
            iVar4 = sqlite3_strnicmp("prefix",(char *)zRight,N);
            if (iVar4 == 0) {
              if (pFVar5->aPrefix == (int *)0x0) {
                piVar10 = (int *)sqlite3Fts5MallocZero((int *)&local_b8,0x7c);
                pFVar5->aPrefix = piVar10;
                azArg = local_40;
                uVar16 = local_48;
                uVar15 = local_b8;
                if (local_b8 != 0) goto LAB_0019f9e5;
              }
              bVar23 = true;
              do {
                pbVar21 = pbVar21 + -1;
                do {
                  bVar14 = pbVar21[1];
                  pbVar21 = pbVar21 + 1;
                } while (bVar14 == 0x20);
                if ((bVar23) || (pbVar18 = pbVar21, bVar14 != 0x2c)) {
                  if (bVar14 != 0) goto LAB_0019f5f2;
                  bVar2 = false;
                }
                else {
                  do {
                    pbVar21 = pbVar18 + 1;
                    pbVar22 = pbVar18 + 1;
                    pbVar18 = pbVar21;
                  } while (*pbVar22 == 0x20);
LAB_0019f5f2:
                  bVar14 = *pbVar21;
                  if ((byte)(bVar14 - 0x3a) < 0xf6) {
                    pcVar7 = "malformed prefix=... directive";
LAB_0019f606:
                    pcVar7 = sqlite3_mprintf(pcVar7);
                  }
                  else {
                    if ((long)pFVar5->nPrefix != 0x1f) {
                      iVar4 = 0;
                      if ('/' < (char)bVar14) {
                        iVar4 = 0;
                        do {
                          if ((0x39 < bVar14) || (999 < iVar4)) break;
                          iVar4 = (int)(char)(bVar14 - 0x30) + iVar4 * 10;
                          bVar14 = pbVar21[1];
                          pbVar21 = pbVar21 + 1;
                        } while ('/' < (char)bVar14);
                      }
                      if (0xfffffc18 < iVar4 - 1000U) {
                        pFVar5->aPrefix[pFVar5->nPrefix] = iVar4;
                        pFVar5->nPrefix = pFVar5->nPrefix + 1;
                        bVar23 = false;
                        bVar2 = true;
                        goto LAB_0019f640;
                      }
                      pcVar7 = "prefix length out of range (max 999)";
                      goto LAB_0019f606;
                    }
                    pcVar7 = sqlite3_mprintf("too many prefix indexes (max %d)");
                  }
                  bVar2 = false;
                  *local_b0 = pcVar7;
                  local_b8 = 1;
                }
LAB_0019f640:
                azArg = local_40;
                uVar16 = local_48;
                uVar15 = local_b8;
              } while (bVar2);
            }
            else {
              iVar4 = sqlite3_strnicmp("tokenize",(char *)zRight,N);
              if (iVar4 == 0) {
                sVar9 = strlen((char *)pbVar21);
                ppcVar6 = (char **)sqlite3Fts5MallocZero((int *)&local_b8,sVar9 * 8 + 8);
                local_60 = (byte *)sqlite3Fts5MallocZero((int *)&local_b8,sVar9 * 2 + 2);
                if (local_60 != (byte *)0x0 && ppcVar6 != (char **)0x0) {
                  if (*local_68 == (Fts5Tokenizer *)0x0) {
                    lVar19 = 0;
                    local_90 = local_60;
                    local_70 = ppcVar6;
                    do {
                      ppcVar6 = local_70;
                      if (*pbVar21 == 0) {
                        local_b8 = sqlite3Fts5GetTokenizer
                                             (local_58,local_70,(int)lVar19,local_68,local_38,
                                              local_b0);
                        goto LAB_0019f9c2;
                      }
                      pbVar18 = pbVar21 + -1;
                      pbVar22 = pbVar21 + -2;
                      pbVar21 = pbVar18;
                      do {
                        pbVar11 = pbVar21 + 1;
                        pbVar21 = pbVar21 + 1;
                        pbVar22 = pbVar22 + 1;
                        pbVar18 = pbVar18 + 1;
                      } while (*pbVar11 == 0x20);
                      if (*pbVar11 == 0x27) {
                        pbVar11 = (byte *)fts5ConfigSkipLiteral((char *)pbVar21);
                      }
                      else {
                        lVar12 = 0;
                        while (((long)(char)pbVar21[lVar12] < 0 ||
                               ((&DAT_001dc110)[(char)pbVar21[lVar12]] != '\0'))) {
                          lVar12 = lVar12 + 1;
                        }
                        pbVar11 = pbVar21 + lVar12;
                        if (lVar12 == 0) {
                          pbVar11 = (byte *)0x0;
                        }
                      }
                      pbVar3 = local_90;
                      if (pbVar11 == (byte *)0x0) {
                        pbVar21 = (byte *)0x0;
                      }
                      else {
                        memcpy(local_90,pbVar21,(long)pbVar11 - (long)pbVar18);
                        local_70[lVar19] = (char *)pbVar3;
                        uVar15 = *pbVar3 - 0x22;
                        if ((uVar15 < 0x3f) &&
                           ((0x4200000000000021U >> ((ulong)uVar15 & 0x3f) & 1) != 0)) {
                          fts5Dequote((char *)local_90);
                        }
                        pbVar21 = pbVar11 + -1;
                        do {
                          pbVar18 = pbVar21 + 1;
                          pbVar21 = pbVar21 + 1;
                        } while (*pbVar18 == 0x20);
                        local_90 = local_90 + (long)pbVar11 + -(long)pbVar22;
                      }
                      pFVar5 = local_a8;
                      lVar19 = lVar19 + 1;
                    } while (pbVar21 != (byte *)0x0);
                    pcVar7 = sqlite3_mprintf("parse error in tokenize directive");
                    *local_b0 = pcVar7;
                    local_b8 = 1;
                    ppcVar6 = local_70;
                  }
                  else {
                    pcVar7 = sqlite3_mprintf("multiple tokenize=... directives");
                    *local_b0 = pcVar7;
                    local_b8 = 1;
                  }
                }
LAB_0019f9c2:
                sqlite3_free(ppcVar6);
                sqlite3_free(local_60);
                azArg = local_40;
                uVar16 = local_48;
                uVar15 = local_b8;
              }
              else {
                iVar4 = sqlite3_strnicmp("content",(char *)zRight,N);
                if (iVar4 == 0) {
                  if (pFVar5->eContent == 0) {
                    if (*pbVar21 == 0) {
                      pFVar5->eContent = 1;
                      azArg = local_40;
                      uVar16 = local_48;
                      uVar15 = local_b8;
                    }
                    else {
                      pFVar5->eContent = 2;
                      pcVar7 = sqlite3Fts5Mprintf((int *)&local_b8,"%Q.%Q",pFVar5->zDb,pbVar21);
                      pFVar5->zContent = pcVar7;
                      azArg = local_40;
                      uVar16 = local_48;
                      uVar15 = local_b8;
                    }
                  }
                  else {
                    pcVar7 = "multiple content=... directives";
LAB_0019f7a4:
                    pcVar7 = sqlite3_mprintf(pcVar7);
                    *local_b0 = pcVar7;
                    local_b8 = 1;
                    azArg = local_40;
                    uVar16 = local_48;
                    uVar15 = local_b8;
                  }
                }
                else {
                  iVar4 = sqlite3_strnicmp("content_rowid",(char *)zRight,N);
                  if (iVar4 == 0) {
                    if (pFVar5->zContentRowid != (char *)0x0) {
                      pcVar7 = "multiple content_rowid=... directives";
                      goto LAB_0019f7a4;
                    }
                    pcVar7 = sqlite3Fts5Strndup((int *)&local_b8,(char *)pbVar21,-1);
                    pFVar5->zContentRowid = pcVar7;
                    azArg = local_40;
                    uVar16 = local_48;
                    uVar15 = local_b8;
                  }
                  else {
                    iVar4 = sqlite3_strnicmp("columnsize",(char *)zRight,N);
                    if (iVar4 == 0) {
                      if (((*pbVar21 & 0xfe) != 0x30) || (pbVar21[1] != 0)) {
                        pcVar7 = "malformed columnsize=... directive";
                        goto LAB_0019f7a4;
                      }
                      pFVar5->bColumnsize = (uint)(*pbVar21 == 0x31);
                      azArg = local_40;
                      uVar16 = local_48;
                      uVar15 = local_b8;
                    }
                    else {
                      iVar4 = sqlite3_strnicmp("detail",(char *)zRight,N);
                      if (iVar4 == 0) {
                        sVar9 = strlen((char *)pbVar21);
                        uVar15 = 0xffffffff;
                        lVar19 = 0x10;
                        pcVar7 = "none";
                        do {
                          iVar4 = sqlite3_strnicmp(pcVar7,(char *)pbVar21,(int)sVar9);
                          pFVar5 = local_a8;
                          if (iVar4 == 0) {
                            if (-1 < (int)uVar15) {
                              uVar15 = 1;
                              goto LAB_0019fa32;
                            }
                            uVar15 = *(uint *)(&UNK_0020d2e8 + lVar19);
                          }
                          pcVar7 = *(char **)(&DAT_0020d2f0 + lVar19);
                          lVar19 = lVar19 + 0x10;
                        } while (lVar19 != 0x40);
                        local_a8->eDetail = uVar15;
                        uVar15 = uVar15 >> 0x1f;
LAB_0019fa32:
                        azArg = local_40;
                        uVar16 = local_48;
                        local_b8 = uVar15;
                        if (uVar15 != 0) {
                          pcVar7 = sqlite3_mprintf("malformed detail=... directive");
                          *local_b0 = pcVar7;
                          azArg = local_40;
                          uVar16 = local_48;
                        }
                      }
                      else {
                        pcVar7 = sqlite3_mprintf("unrecognized option: \"%.*s\"",sVar9 & 0xffffffff,
                                                 zRight);
                        *local_b0 = pcVar7;
                        azArg = local_40;
                        uVar16 = local_48;
                        uVar15 = 1;
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            if ((local_88.p == (u8 *)0x0) ||
               ((iVar4 = sqlite3StrICmp((char *)local_88.p,"rank"), iVar4 != 0 &&
                (iVar4 = sqlite3StrICmp((char *)zRight,"rowid"), iVar4 != 0)))) {
              uVar15 = 0;
              if (pbVar21 != (byte *)0x0) {
                iVar4 = sqlite3StrICmp((char *)pbVar21,"unindexed");
                if (iVar4 != 0) {
                  pcVar7 = "unrecognized column option: %s";
                  goto LAB_0019f578;
                }
                pFVar5->abUnindexed[pFVar5->nCol] = '\x01';
                uVar15 = 0;
              }
            }
            else {
              pcVar7 = "reserved fts5 column name: %s";
LAB_0019f578:
              pcVar7 = sqlite3_mprintf(pcVar7);
              *local_b0 = pcVar7;
              uVar15 = 1;
            }
            iVar4 = pFVar5->nCol;
            pFVar5->nCol = iVar4 + 1;
            pFVar5->azCol[iVar4] = (char *)zRight;
            local_88.p = (u8 *)0x0;
            azArg = local_40;
            uVar16 = local_48;
          }
        }
LAB_0019f9e5:
        local_b4 = uVar15;
        sqlite3_free(local_88.p);
        sqlite3_free(local_a0);
        bVar23 = local_b4 == 0;
      } while ((bVar23) && (uVar17 = uVar17 + 1, uVar17 < uVar16));
    }
    if ((bVar23) && (pFVar5->pTok == (Fts5Tokenizer *)0x0)) {
      local_b4 = sqlite3Fts5GetTokenizer
                           (local_58,(char **)0x0,0,&pFVar5->pTok,&pFVar5->pTokApi,(char **)0x0);
    }
    ppFVar20 = local_50;
    pFVar5 = local_a8;
    if ((local_b4 == 0) && (local_a8->zContent == (char *)0x0)) {
      if (local_a8->eContent == 0) {
        pcVar7 = "content";
        bVar23 = false;
      }
      else {
        pcVar7 = (char *)0x0;
        bVar23 = local_a8->bColumnsize == 0;
        if (!bVar23) {
          pcVar7 = "docsize";
        }
      }
      if (!bVar23) {
        pcVar7 = sqlite3Fts5Mprintf((int *)&local_b4,"%Q.\'%q_%s\'",local_a8->zDb,local_a8->zName,
                                    pcVar7);
        pFVar5->zContent = pcVar7;
      }
    }
    if ((local_b4 == 0) && (local_a8->zContentRowid == (char *)0x0)) {
      pcVar7 = sqlite3Fts5Strndup((int *)&local_b4,"rowid",-1);
      local_a8->zContentRowid = pcVar7;
    }
    pFVar5 = local_a8;
    if (local_b4 == 0) {
      local_a0 = (byte *)((ulong)local_a0 & 0xffffffff00000000);
      local_88.p = (u8 *)0x0;
      local_88.n = 0;
      local_88.nSpace = 0;
      sqlite3Fts5BufferAppendPrintf((int *)&local_a0,&local_88,"T.%Q",local_a8->zContentRowid);
      if ((pFVar5->eContent != 1) && (0 < pFVar5->nCol)) {
        uVar16 = 0;
        do {
          if (pFVar5->eContent == 2) {
            sqlite3Fts5BufferAppendPrintf((int *)&local_a0,&local_88,", T.%Q",pFVar5->azCol[uVar16])
            ;
          }
          else {
            sqlite3Fts5BufferAppendPrintf((int *)&local_a0,&local_88,", T.c%d",uVar16 & 0xffffffff);
          }
          uVar16 = uVar16 + 1;
        } while ((long)uVar16 < (long)pFVar5->nCol);
      }
      pFVar5->zContentExprlist = (char *)local_88.p;
      local_b4 = (uint)local_a0;
      ppFVar20 = local_50;
    }
    uVar15 = local_b4;
    if (local_b4 != 0) {
      sqlite3Fts5ConfigFree(local_a8);
      *ppFVar20 = (Fts5Config *)0x0;
    }
  }
  return uVar15;
}

Assistant:

static int sqlite3Fts5ConfigParse(
  Fts5Global *pGlobal,
  sqlite3 *db,
  int nArg,                       /* Number of arguments */
  const char **azArg,             /* Array of nArg CREATE VIRTUAL TABLE args */
  Fts5Config **ppOut,             /* OUT: Results of parse */
  char **pzErr                    /* OUT: Error message */
){
  int rc = SQLITE_OK;             /* Return code */
  Fts5Config *pRet;               /* New object to return */
  int i;
  sqlite3_int64 nByte;

  *ppOut = pRet = (Fts5Config*)sqlite3_malloc(sizeof(Fts5Config));
  if( pRet==0 ) return SQLITE_NOMEM;
  memset(pRet, 0, sizeof(Fts5Config));
  pRet->db = db;
  pRet->iCookie = -1;

  nByte = nArg * (sizeof(char*) + sizeof(u8));
  pRet->azCol = (char**)sqlite3Fts5MallocZero(&rc, nByte);
  pRet->abUnindexed = (u8*)&pRet->azCol[nArg];
  pRet->zDb = sqlite3Fts5Strndup(&rc, azArg[1], -1);
  pRet->zName = sqlite3Fts5Strndup(&rc, azArg[2], -1);
  pRet->bColumnsize = 1;
  pRet->eDetail = FTS5_DETAIL_FULL;
#ifdef SQLITE_DEBUG
  pRet->bPrefixIndex = 1;
#endif
  if( rc==SQLITE_OK && sqlite3_stricmp(pRet->zName, FTS5_RANK_NAME)==0 ){
    *pzErr = sqlite3_mprintf("reserved fts5 table name: %s", pRet->zName);
    rc = SQLITE_ERROR;
  }

  for(i=3; rc==SQLITE_OK && i<nArg; i++){
    const char *zOrig = azArg[i];
    const char *z;
    char *zOne = 0;
    char *zTwo = 0;
    int bOption = 0;
    int bMustBeCol = 0;

    z = fts5ConfigGobbleWord(&rc, zOrig, &zOne, &bMustBeCol);
    z = fts5ConfigSkipWhitespace(z);
    if( z && *z=='=' ){
      bOption = 1;
      z++;
      if( bMustBeCol ) z = 0;
    }
    z = fts5ConfigSkipWhitespace(z);
    if( z && z[0] ){
      int bDummy;
      z = fts5ConfigGobbleWord(&rc, z, &zTwo, &bDummy);
      if( z && z[0] ) z = 0;
    }

    if( rc==SQLITE_OK ){
      if( z==0 ){
        *pzErr = sqlite3_mprintf("parse error in \"%s\"", zOrig);
        rc = SQLITE_ERROR;
      }else{
        if( bOption ){
          rc = fts5ConfigParseSpecial(pGlobal, pRet, zOne, zTwo?zTwo:"", pzErr);
        }else{
          rc = fts5ConfigParseColumn(pRet, zOne, zTwo, pzErr);
          zOne = 0;
        }
      }
    }

    sqlite3_free(zOne);
    sqlite3_free(zTwo);
  }

  /* If a tokenizer= option was successfully parsed, the tokenizer has
  ** already been allocated. Otherwise, allocate an instance of the default
  ** tokenizer (unicode61) now.  */
  if( rc==SQLITE_OK && pRet->pTok==0 ){
    rc = fts5ConfigDefaultTokenizer(pGlobal, pRet);
  }

  /* If no zContent option was specified, fill in the default values. */
  if( rc==SQLITE_OK && pRet->zContent==0 ){
    const char *zTail = 0;
    assert( pRet->eContent==FTS5_CONTENT_NORMAL 
         || pRet->eContent==FTS5_CONTENT_NONE 
    );
    if( pRet->eContent==FTS5_CONTENT_NORMAL ){
      zTail = "content";
    }else if( pRet->bColumnsize ){
      zTail = "docsize";
    }

    if( zTail ){
      pRet->zContent = sqlite3Fts5Mprintf(
          &rc, "%Q.'%q_%s'", pRet->zDb, pRet->zName, zTail
      );
    }
  }

  if( rc==SQLITE_OK && pRet->zContentRowid==0 ){
    pRet->zContentRowid = sqlite3Fts5Strndup(&rc, "rowid", -1);
  }

  /* Formulate the zContentExprlist text */
  if( rc==SQLITE_OK ){
    rc = fts5ConfigMakeExprlist(pRet);
  }

  if( rc!=SQLITE_OK ){
    sqlite3Fts5ConfigFree(pRet);
    *ppOut = 0;
  }
  return rc;
}